

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Framebuffer.cpp
# Opt level: O2

Ptr<Framebuffer> __thiscall
myvk::Framebuffer::Create(Framebuffer *this,Ptr<RenderPass> *render_pass,Ptr<ImageView> *image_view)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<Framebuffer> PVar2;
  initializer_list<std::shared_ptr<myvk::ImageView>_> __l;
  allocator_type local_51;
  __shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> local_50;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  local_40;
  VkExtent2D local_28;
  
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)
  ;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::vector(&local_40,__l,&local_51);
  peVar1 = (((image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.width = (peVar1->m_extent).width;
  local_28.height = (peVar1->m_extent).height;
  Create(this,render_pass,&local_40,&local_28,1);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::~vector(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  PVar2.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Framebuffer>)PVar2.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Framebuffer> Framebuffer::Create(const Ptr<RenderPass> &render_pass, const Ptr<ImageView> &image_view) {
	return Create(render_pass, {image_view}, image_view->GetImagePtr()->GetExtent2D(), 1);
}